

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  uint uVar1;
  bool bVar2;
  type_conflict5 tVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  element_type *peVar7;
  ulong *puVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *eps;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  cpp_dec_float<200U,_int,_void> *in_RSI;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  largeValue;
  bool zerovalid;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_ffffffffffffe068;
  undefined2 in_stack_ffffffffffffe06c;
  undefined1 in_stack_ffffffffffffe06e;
  undefined1 in_stack_ffffffffffffe06f;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe070;
  undefined4 in_stack_ffffffffffffe078;
  undefined1 in_stack_ffffffffffffe07c;
  undefined1 in_stack_ffffffffffffe07d;
  undefined1 in_stack_ffffffffffffe07e;
  undefined1 in_stack_ffffffffffffe07f;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffe080;
  undefined5 in_stack_ffffffffffffe088;
  undefined1 in_stack_ffffffffffffe08d;
  undefined1 in_stack_ffffffffffffe08e;
  undefined1 in_stack_ffffffffffffe08f;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe090;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe0a8;
  undefined1 *in_stack_ffffffffffffe0e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe0e8;
  undefined7 in_stack_ffffffffffffe0f0;
  undefined1 in_stack_ffffffffffffe0f7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe0f8;
  undefined4 in_stack_ffffffffffffe100;
  undefined1 in_stack_ffffffffffffe104;
  undefined1 in_stack_ffffffffffffe105;
  undefined1 in_stack_ffffffffffffe106;
  undefined1 in_stack_ffffffffffffe107;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1ef8;
  undefined5 in_stack_ffffffffffffe180;
  undefined1 in_stack_ffffffffffffe185;
  undefined1 in_stack_ffffffffffffe186;
  byte in_stack_ffffffffffffe187;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffe188;
  bool local_1e02;
  undefined1 local_1d10 [128];
  undefined1 local_1c90 [128];
  undefined1 local_1c10 [128];
  undefined8 local_1b90;
  undefined1 local_1b88 [48];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe4a8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe4b0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe4b8;
  undefined1 local_1b08 [128];
  undefined8 local_1a88 [17];
  undefined8 local_1a00;
  undefined1 local_19f8 [128];
  undefined1 local_1978 [256];
  undefined8 local_1878;
  undefined1 local_1870 [128];
  undefined1 local_17f0 [144];
  undefined1 local_1760 [128];
  undefined1 local_16e0 [128];
  undefined1 local_1660 [128];
  undefined1 local_15e0 [144];
  ulong local_1550;
  undefined1 local_1548 [128];
  undefined1 local_14c8 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1448;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13c8 [2];
  undefined4 local_12c8;
  undefined4 local_1244;
  cpp_dec_float<200U,_int,_void> local_1240;
  undefined1 local_11b0 [256];
  undefined4 local_10b0;
  undefined4 local_102c;
  ulong local_1018;
  undefined1 local_100c [128];
  undefined1 local_f8c [387];
  byte local_e09;
  undefined1 local_df8 [128];
  undefined1 local_d78 [144];
  ulong local_ce8;
  undefined1 local_cdc [128];
  undefined1 local_c5c [128];
  undefined1 local_bdc [128];
  uint local_b5c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b58;
  undefined4 local_b4c;
  undefined4 local_b48;
  int local_b44;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b40;
  undefined8 local_ac0;
  undefined1 local_ab8 [144];
  undefined1 local_a28 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9a8;
  undefined8 local_928;
  undefined1 local_91c [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_89c;
  byte local_819;
  undefined1 local_818 [128];
  undefined1 local_798 [128];
  undefined1 local_718 [128];
  undefined1 local_698 [288];
  cpp_dec_float<200U,_int,_void> *local_578;
  undefined8 local_568;
  undefined8 local_560;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined1 *local_540;
  undefined8 local_538;
  ulong *local_530;
  undefined1 *local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined1 *local_510;
  undefined8 local_508;
  ulong *local_500;
  undefined1 *local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  uint *local_4e0;
  undefined8 local_4d8;
  ulong *local_4d0;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined8 *local_4a0;
  undefined1 *local_498;
  undefined8 local_490;
  undefined8 *local_488;
  undefined1 *local_480;
  undefined4 *local_478;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_470;
  undefined4 *local_468;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  long local_458;
  undefined1 *local_450;
  long local_448;
  undefined1 *local_440;
  long local_438;
  undefined1 *local_430;
  long local_428;
  undefined1 *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  undefined1 *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  undefined1 *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  undefined1 *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  undefined1 *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined1 *local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  undefined1 *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  undefined1 *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  undefined1 *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  undefined1 *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  undefined1 *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  undefined1 *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  undefined1 *local_328;
  long local_320;
  undefined1 *local_318;
  long local_310;
  undefined1 *local_308;
  long local_300;
  undefined1 *local_2f8;
  long local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  undefined4 *local_298;
  undefined4 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  ulong *local_270;
  undefined8 local_268;
  ulong *local_260;
  undefined8 local_258;
  ulong *local_250;
  undefined8 local_248;
  undefined8 local_240;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_231;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_208;
  undefined1 *local_200;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  undefined1 *local_1c0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  undefined1 *local_180;
  undefined8 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined8 *local_168;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_159;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  undefined8 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_578 = in_RSI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x716474);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe080,
               CONCAT13(in_stack_ffffffffffffe07f,
                        CONCAT12(in_stack_ffffffffffffe07e,
                                 CONCAT11(in_stack_ffffffffffffe07d,in_stack_ffffffffffffe07c))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x716490);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe080,
               CONCAT13(in_stack_ffffffffffffe07f,
                        CONCAT12(in_stack_ffffffffffffe07e,
                                 CONCAT11(in_stack_ffffffffffffe07d,in_stack_ffffffffffffe07c))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x7164bc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe080,
               CONCAT13(in_stack_ffffffffffffe07f,
                        CONCAT12(in_stack_ffffffffffffe07e,
                                 CONCAT11(in_stack_ffffffffffffe07d,in_stack_ffffffffffffe07c))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x7164e8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe080,
               CONCAT13(in_stack_ffffffffffffe07f,
                        CONCAT12(in_stack_ffffffffffffe07e,
                                 CONCAT11(in_stack_ffffffffffffe07d,in_stack_ffffffffffffe07c))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x716514);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe080,
               CONCAT13(in_stack_ffffffffffffe07f,
                        CONCAT12(in_stack_ffffffffffffe07e,
                                 CONCAT11(in_stack_ffffffffffffe07d,in_stack_ffffffffffffe07c))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x716540);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe080,
               CONCAT13(in_stack_ffffffffffffe07f,
                        CONCAT12(in_stack_ffffffffffffe07e,
                                 CONCAT11(in_stack_ffffffffffffe07d,in_stack_ffffffffffffe07c))));
  lVar6 = in_RDI + 0x38;
  local_450 = local_698;
  local_458 = lVar6;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffe06f,
                      CONCAT16(in_stack_ffffffffffffe06e,
                               CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
  local_440 = local_718;
  local_448 = lVar6;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffe06f,
                      CONCAT16(in_stack_ffffffffffffe06e,
                               CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
  local_430 = local_798;
  local_438 = lVar6;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffe06f,
                      CONCAT16(in_stack_ffffffffffffe06e,
                               CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
  local_420 = local_818;
  local_428 = lVar6;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffe06f,
                      CONCAT16(in_stack_ffffffffffffe06e,
                               CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
  local_819 = 1;
  local_560 = infinity();
  local_558 = &local_89c;
  local_568 = 0;
  local_240 = local_560;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffe080,
             (double)CONCAT17(in_stack_ffffffffffffe07f,
                              CONCAT16(in_stack_ffffffffffffe07e,
                                       CONCAT15(in_stack_ffffffffffffe07d,
                                                CONCAT14(in_stack_ffffffffffffe07c,
                                                         in_stack_ffffffffffffe078)))),
             in_stack_ffffffffffffe070);
  local_928 = 0x3ff0000000000000;
  feastol(in_stack_ffffffffffffe0a8);
  local_30 = &local_928;
  local_38 = &local_9a8;
  local_28 = local_91c;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_38);
  local_20 = local_91c;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
  local_8 = local_30;
  local_18 = local_38;
  local_10 = local_91c;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
             (double *)
             CONCAT17(in_stack_ffffffffffffe06f,
                      CONCAT16(in_stack_ffffffffffffe06e,
                               CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))),
             (cpp_dec_float<200U,_int,_void> *)0x716781);
  local_548 = infinity();
  local_540 = local_a28;
  local_550 = 0;
  local_248 = local_548;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffe080,
             (double)CONCAT17(in_stack_ffffffffffffe07f,
                              CONCAT16(in_stack_ffffffffffffe07e,
                                       CONCAT15(in_stack_ffffffffffffe07d,
                                                CONCAT14(in_stack_ffffffffffffe07c,
                                                         in_stack_ffffffffffffe078)))),
             in_stack_ffffffffffffe070);
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffe06f,
                           CONCAT16(in_stack_ffffffffffffe06e,
                                    CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))))
  ;
  peVar7 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x716809);
  Tolerances::epsilon(peVar7);
  bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffe107,
                                 CONCAT16(in_stack_ffffffffffffe106,
                                          CONCAT15(in_stack_ffffffffffffe105,
                                                   CONCAT14(in_stack_ffffffffffffe104,
                                                            in_stack_ffffffffffffe100)))),
                     in_stack_ffffffffffffe0f8,
                     (double)CONCAT17(in_stack_ffffffffffffe0f7,in_stack_ffffffffffffe0f0));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x716850);
  if (bVar2) {
    local_ac0 = 0x3ff0000000000000;
    feastol(in_stack_ffffffffffffe0a8);
    local_70 = &local_ac0;
    local_78 = &local_b40;
    local_68 = local_ab8;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_79,local_78);
    local_60 = local_ab8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
    local_48 = local_70;
    local_58 = local_78;
    local_50 = local_ab8;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (double *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))),
               (cpp_dec_float<200U,_int,_void> *)0x716940);
    local_330 = &local_89c;
    local_338 = local_ab8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
  }
  local_b44 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x716a47);
  while (local_b44 = local_b44 + -1, -1 < local_b44) {
    local_b48 = 0;
    local_460 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
    local_468 = &local_b48;
    local_298 = local_468;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    local_b4c = 0;
    local_470 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
    local_478 = &local_b4c;
    local_290 = local_478;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    local_b58 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector(in_stack_ffffffffffffe070,
                            CONCAT13(in_stack_ffffffffffffe06f,
                                     CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)))
    ;
    for (local_b5c = 0; uVar1 = local_b5c,
        iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_b58), (int)uVar1 < iVar5; local_b5c = local_b5c + 1) {
      local_418 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_b58,local_b5c);
      local_410 = local_bdc;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe06f,
                          CONCAT16(in_stack_ffffffffffffe06e,
                                   CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index(local_b58,(char *)(ulong)local_b5c,__c);
      local_e09 = 0;
      local_408 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffe070,
                        CONCAT13(in_stack_ffffffffffffe06f,
                                 CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
      local_400 = local_c5c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe06f,
                          CONCAT16(in_stack_ffffffffffffe06e,
                                   CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
      puVar8 = (ulong *)infinity();
      local_ce8 = *puVar8 ^ 0x8000000000000000;
      local_528 = local_cdc;
      local_530 = &local_ce8;
      local_538 = 0;
      local_250 = local_530;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe080,
                 (double)CONCAT17(in_stack_ffffffffffffe07f,
                                  CONCAT16(in_stack_ffffffffffffe07e,
                                           CONCAT15(in_stack_ffffffffffffe07d,
                                                    CONCAT14(in_stack_ffffffffffffe07c,
                                                             in_stack_ffffffffffffe078)))),
                 in_stack_ffffffffffffe070);
      SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT17(in_stack_ffffffffffffe06f,
                               CONCAT16(in_stack_ffffffffffffe06e,
                                        CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068
                                                ))));
      peVar7 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x716cf9);
      Tolerances::epsilon(peVar7);
      bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe0f7,in_stack_ffffffffffffe0f0),
                         in_stack_ffffffffffffe0e8,(double)in_stack_ffffffffffffe0e0);
      local_1e02 = false;
      if (bVar2) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index(local_b58,(char *)(ulong)local_b5c,__c_00);
        local_3f8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rhs(in_stack_ffffffffffffe070,
                          CONCAT13(in_stack_ffffffffffffe06f,
                                   CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
        local_3f0 = local_d78;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                  );
        local_518 = infinity();
        local_510 = local_df8;
        local_520 = 0;
        local_258 = local_518;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe080,
                   (double)CONCAT17(in_stack_ffffffffffffe07f,
                                    CONCAT16(in_stack_ffffffffffffe07e,
                                             CONCAT15(in_stack_ffffffffffffe07d,
                                                      CONCAT14(in_stack_ffffffffffffe07c,
                                                               in_stack_ffffffffffffe078)))),
                   in_stack_ffffffffffffe070);
        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_ffffffffffffe06f,
                                 CONCAT16(in_stack_ffffffffffffe06e,
                                          CONCAT24(in_stack_ffffffffffffe06c,
                                                   in_stack_ffffffffffffe068))));
        local_e09 = 1;
        peVar7 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x716e4b);
        Tolerances::epsilon(peVar7);
        local_1e02 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT17(in_stack_ffffffffffffe107,
                                            CONCAT16(in_stack_ffffffffffffe106,
                                                     CONCAT15(in_stack_ffffffffffffe105,
                                                              CONCAT14(in_stack_ffffffffffffe104,
                                                                       in_stack_ffffffffffffe100))))
                                ,in_stack_ffffffffffffe0f8,
                                (double)CONCAT17(in_stack_ffffffffffffe0f7,in_stack_ffffffffffffe0f0
                                                ));
      }
      if ((local_e09 & 1) != 0) {
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x716ebc)
        ;
      }
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x716ec9);
      if (local_1e02 == false) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index(local_b58,(char *)(ulong)local_b5c,__c_01);
        local_3e8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lhs(in_stack_ffffffffffffe070,
                          CONCAT13(in_stack_ffffffffffffe06f,
                                   CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
        local_3e0 = local_f8c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                  );
        puVar8 = (ulong *)infinity();
        local_1018 = *puVar8 ^ 0x8000000000000000;
        local_4f8 = local_100c;
        local_500 = &local_1018;
        local_508 = 0;
        local_260 = local_500;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe080,
                   (double)CONCAT17(in_stack_ffffffffffffe07f,
                                    CONCAT16(in_stack_ffffffffffffe07e,
                                             CONCAT15(in_stack_ffffffffffffe07d,
                                                      CONCAT14(in_stack_ffffffffffffe07c,
                                                               in_stack_ffffffffffffe078)))),
                   in_stack_ffffffffffffe070);
        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_ffffffffffffe06f,
                                 CONCAT16(in_stack_ffffffffffffe06e,
                                          CONCAT24(in_stack_ffffffffffffe06c,
                                                   in_stack_ffffffffffffe068))));
        peVar7 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x71709b);
        Tolerances::epsilon(peVar7);
        bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffe0f7,in_stack_ffffffffffffe0f0),
                           in_stack_ffffffffffffe0e8,(double)in_stack_ffffffffffffe0e0);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x7170e2)
        ;
        if (bVar2) {
          local_102c = 0;
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT17(in_stack_ffffffffffffe07f,
                                         CONCAT16(in_stack_ffffffffffffe07e,
                                                  CONCAT15(in_stack_ffffffffffffe07d,
                                                           CONCAT14(in_stack_ffffffffffffe07c,
                                                                    in_stack_ffffffffffffe078)))),
                             (int *)in_stack_ffffffffffffe070);
          if (tVar3) {
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffe070,
                         CONCAT13(in_stack_ffffffffffffe06f,
                                  CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe07f,
                                     CONCAT16(in_stack_ffffffffffffe07e,
                                              CONCAT15(in_stack_ffffffffffffe07d,
                                                       CONCAT14(in_stack_ffffffffffffe07c,
                                                                in_stack_ffffffffffffe078)))),
                         (int)((ulong)in_stack_ffffffffffffe070 >> 0x20));
          }
          else {
            local_10b0 = 0;
            tVar3 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT17(in_stack_ffffffffffffe07f,
                                           CONCAT16(in_stack_ffffffffffffe07e,
                                                    CONCAT15(in_stack_ffffffffffffe07d,
                                                             CONCAT14(in_stack_ffffffffffffe07c,
                                                                      in_stack_ffffffffffffe078)))),
                               (int *)in_stack_ffffffffffffe070);
            if (tVar3) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffe070,
                           CONCAT13(in_stack_ffffffffffffe06f,
                                    CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffe07f,
                                       CONCAT16(in_stack_ffffffffffffe07e,
                                                CONCAT15(in_stack_ffffffffffffe07d,
                                                         CONCAT14(in_stack_ffffffffffffe07c,
                                                                  in_stack_ffffffffffffe078)))),
                           (int)((ulong)in_stack_ffffffffffffe070 >> 0x20));
            }
          }
        }
        else {
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_b58,(char *)(ulong)local_b5c,__c_02);
          local_3d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::rhs(in_stack_ffffffffffffe070,
                            CONCAT13(in_stack_ffffffffffffe06f,
                                     CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)))
          ;
          local_3d0 = local_11b0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)
                                      )));
          local_4e8 = infinity();
          local_4e0 = local_1240.data._M_elems + 4;
          local_4f0 = 0;
          local_268 = local_4e8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffe080,
                     (double)CONCAT17(in_stack_ffffffffffffe07f,
                                      CONCAT16(in_stack_ffffffffffffe07e,
                                               CONCAT15(in_stack_ffffffffffffe07d,
                                                        CONCAT14(in_stack_ffffffffffffe07c,
                                                                 in_stack_ffffffffffffe078)))),
                     in_stack_ffffffffffffe070);
          in_stack_ffffffffffffe188 = &local_1240;
          SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_ffffffffffffe06f,
                                   CONCAT16(in_stack_ffffffffffffe06e,
                                            CONCAT24(in_stack_ffffffffffffe06c,
                                                     in_stack_ffffffffffffe068))));
          peVar7 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x7172d8);
          Tolerances::epsilon(peVar7);
          in_stack_ffffffffffffe187 =
               LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)CONCAT17(in_stack_ffffffffffffe107,
                                      CONCAT16(in_stack_ffffffffffffe106,
                                               CONCAT15(in_stack_ffffffffffffe105,
                                                        CONCAT14(in_stack_ffffffffffffe104,
                                                                 in_stack_ffffffffffffe100)))),
                          in_stack_ffffffffffffe0f8,
                          (double)CONCAT17(in_stack_ffffffffffffe0f7,in_stack_ffffffffffffe0f0));
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x71731f);
          if ((in_stack_ffffffffffffe187 & 1) != 0) {
            local_1244 = 0;
            in_stack_ffffffffffffe186 =
                 boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT17(in_stack_ffffffffffffe07f,
                                        CONCAT16(in_stack_ffffffffffffe07e,
                                                 CONCAT15(in_stack_ffffffffffffe07d,
                                                          CONCAT14(in_stack_ffffffffffffe07c,
                                                                   in_stack_ffffffffffffe078)))),
                            (int *)in_stack_ffffffffffffe070);
            if ((bool)in_stack_ffffffffffffe186) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffe070,
                           CONCAT13(in_stack_ffffffffffffe06f,
                                    CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffe07f,
                                       CONCAT16(in_stack_ffffffffffffe07e,
                                                CONCAT15(in_stack_ffffffffffffe07d,
                                                         CONCAT14(in_stack_ffffffffffffe07c,
                                                                  in_stack_ffffffffffffe078)))),
                           (int)((ulong)in_stack_ffffffffffffe070 >> 0x20));
            }
            else {
              local_12c8 = 0;
              in_stack_ffffffffffffe185 =
                   boost::multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT17(in_stack_ffffffffffffe07f,
                                          CONCAT16(in_stack_ffffffffffffe07e,
                                                   CONCAT15(in_stack_ffffffffffffe07d,
                                                            CONCAT14(in_stack_ffffffffffffe07c,
                                                                     in_stack_ffffffffffffe078)))),
                              (int *)in_stack_ffffffffffffe070);
              if ((bool)in_stack_ffffffffffffe185) {
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
                boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT17(in_stack_ffffffffffffe07f,
                                         CONCAT16(in_stack_ffffffffffffe07e,
                                                  CONCAT15(in_stack_ffffffffffffe07d,
                                                           CONCAT14(in_stack_ffffffffffffe07c,
                                                                    in_stack_ffffffffffffe078)))),
                             (int)((ulong)in_stack_ffffffffffffe070 >> 0x20));
              }
            }
          }
        }
      }
      else {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffe070,
                     CONCAT13(in_stack_ffffffffffffe06f,
                              CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffe07f,
                                 CONCAT16(in_stack_ffffffffffffe07e,
                                          CONCAT15(in_stack_ffffffffffffe07d,
                                                   CONCAT14(in_stack_ffffffffffffe07c,
                                                            in_stack_ffffffffffffe078)))),
                     (int)((ulong)in_stack_ffffffffffffe070 >> 0x20));
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffe070,
                     CONCAT13(in_stack_ffffffffffffe06f,
                              CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffe07f,
                                 CONCAT16(in_stack_ffffffffffffe07e,
                                          CONCAT15(in_stack_ffffffffffffe07d,
                                                   CONCAT14(in_stack_ffffffffffffe07c,
                                                            in_stack_ffffffffffffe078)))),
                     (int)((ulong)in_stack_ffffffffffffe070 >> 0x20));
      }
    }
    pnVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::lower(in_stack_ffffffffffffe070,
                     CONCAT13(in_stack_ffffffffffffe06f,
                              CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
    local_3c0 = local_13c8;
    local_3c8 = pnVar9;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    eps = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::upper(in_stack_ffffffffffffe070,
                  CONCAT13(in_stack_ffffffffffffe06f,
                           CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
    local_3b0 = &local_1448;
    local_3b8 = eps;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    local_3a0 = local_14c8;
    local_3a8 = local_13c8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    puVar8 = (ulong *)infinity();
    local_1550 = *puVar8 ^ 0x8000000000000000;
    local_4c8 = local_1548;
    local_4d0 = &local_1550;
    local_4d8 = 0;
    local_270 = local_4d0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffe080,
               (double)CONCAT17(in_stack_ffffffffffffe07f,
                                CONCAT16(in_stack_ffffffffffffe07e,
                                         CONCAT15(in_stack_ffffffffffffe07d,
                                                  CONCAT14(in_stack_ffffffffffffe07c,
                                                           in_stack_ffffffffffffe078)))),
               in_stack_ffffffffffffe070);
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffe06f,
                             CONCAT16(in_stack_ffffffffffffe06e,
                                      CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))
                            ));
    peVar7 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7175b7);
    Tolerances::epsilon(peVar7);
    bVar2 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(in_stack_ffffffffffffe0f7,in_stack_ffffffffffffe0f0),
                       in_stack_ffffffffffffe0e8,(double)in_stack_ffffffffffffe0e0);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x7175fe);
    if (bVar2) {
      local_e8 = &local_89c;
      local_e0 = local_1660;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,local_e8);
      local_d8 = local_e8;
      local_d0 = local_1660;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe06f,
                          CONCAT16(in_stack_ffffffffffffe06e,
                                   CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
      local_c8 = local_1660;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe06f,
                                     CONCAT16(in_stack_ffffffffffffe06e,
                                              CONCAT24(in_stack_ffffffffffffe06c,
                                                       in_stack_ffffffffffffe068))),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x7176b6);
      if (tVar3) {
        local_118 = &local_89c;
        local_110 = local_15e0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_119,local_118);
        local_108 = local_118;
        local_100 = local_15e0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                  );
        local_f8 = local_15e0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
      }
      else {
        local_390 = local_15e0;
        local_398 = &local_1448;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                  );
      }
      local_340 = local_13c8;
      local_348 = local_15e0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe06f,
                          CONCAT16(in_stack_ffffffffffffe06e,
                                   CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    }
    local_380 = local_16e0;
    local_388 = &local_1448;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    local_4b8 = infinity();
    local_4b0 = local_1760;
    local_4c0 = 0;
    local_278 = local_4b8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffe080,
               (double)CONCAT17(in_stack_ffffffffffffe07f,
                                CONCAT16(in_stack_ffffffffffffe07e,
                                         CONCAT15(in_stack_ffffffffffffe07d,
                                                  CONCAT14(in_stack_ffffffffffffe07c,
                                                           in_stack_ffffffffffffe078)))),
               in_stack_ffffffffffffe070);
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffe06f,
                             CONCAT16(in_stack_ffffffffffffe06e,
                                      CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))
                            ));
    peVar7 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7178af);
    Tolerances::epsilon(peVar7);
    bVar2 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(in_stack_ffffffffffffe107,
                                   CONCAT16(in_stack_ffffffffffffe106,
                                            CONCAT15(in_stack_ffffffffffffe105,
                                                     CONCAT14(in_stack_ffffffffffffe104,
                                                              in_stack_ffffffffffffe100)))),
                       in_stack_ffffffffffffe0f8,
                       (double)CONCAT17(in_stack_ffffffffffffe0f7,in_stack_ffffffffffffe0f0));
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x7178f6);
    if (bVar2) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower(in_stack_ffffffffffffe070,
              CONCAT13(in_stack_ffffffffffffe06f,
                       CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe06f,
                                     CONCAT16(in_stack_ffffffffffffe06e,
                                              CONCAT24(in_stack_ffffffffffffe06c,
                                                       in_stack_ffffffffffffe068))),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x717939);
      if (tVar3) {
        local_1ef8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::lower(in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
      }
      else {
        local_1ef8 = &local_89c;
      }
      local_2a0 = &local_1448;
      local_2a8 = local_1ef8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe06f,
                          CONCAT16(in_stack_ffffffffffffe06e,
                                   CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    }
    if ((local_819 & 1) != 0) {
      local_370 = local_17f0;
      local_378 = local_13c8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe06f,
                          CONCAT16(in_stack_ffffffffffffe06e,
                                   CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
      local_1878 = 0;
      local_498 = local_1870;
      local_4a0 = &local_1878;
      local_4a8 = 0;
      local_280 = local_4a0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe080,
                 (double)CONCAT17(in_stack_ffffffffffffe07f,
                                  CONCAT16(in_stack_ffffffffffffe07e,
                                           CONCAT15(in_stack_ffffffffffffe07d,
                                                    CONCAT14(in_stack_ffffffffffffe07c,
                                                             in_stack_ffffffffffffe078)))),
                 in_stack_ffffffffffffe070);
      feastol(in_stack_ffffffffffffe0a8);
      in_stack_ffffffffffffe107 =
           LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT17(in_stack_ffffffffffffe107,
                                  CONCAT16(in_stack_ffffffffffffe106,
                                           CONCAT15(in_stack_ffffffffffffe105,
                                                    CONCAT14(in_stack_ffffffffffffe104,
                                                             in_stack_ffffffffffffe100)))),
                      in_stack_ffffffffffffe0f8,
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT17(in_stack_ffffffffffffe0f7,in_stack_ffffffffffffe0f0));
      in_stack_ffffffffffffe106 = false;
      if ((bool)in_stack_ffffffffffffe107) {
        local_360 = local_1978;
        local_368 = &local_1448;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                  );
        local_1a00 = 0;
        local_480 = local_19f8;
        local_488 = &local_1a00;
        local_490 = 0;
        local_288 = local_488;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe080,
                   (double)CONCAT17(in_stack_ffffffffffffe07f,
                                    CONCAT16(in_stack_ffffffffffffe07e,
                                             CONCAT15(in_stack_ffffffffffffe07d,
                                                      CONCAT14(in_stack_ffffffffffffe07c,
                                                               in_stack_ffffffffffffe078)))),
                   in_stack_ffffffffffffe070);
        feastol(in_stack_ffffffffffffe0a8);
        in_stack_ffffffffffffe105 =
             GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT17(in_stack_ffffffffffffe187,
                                    CONCAT16(in_stack_ffffffffffffe186,
                                             CONCAT15(in_stack_ffffffffffffe185,
                                                      in_stack_ffffffffffffe180))),pnVar9,eps);
        in_stack_ffffffffffffe106 = in_stack_ffffffffffffe105;
      }
      if ((bool)in_stack_ffffffffffffe106 == false) {
        local_819 = 0;
      }
      else {
        local_1a88[0] = 0;
        local_170 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe070,
                                 CONCAT13(in_stack_ffffffffffffe06f,
                                          CONCAT12(in_stack_ffffffffffffe06e,
                                                   in_stack_ffffffffffffe06c)));
        local_178 = local_1a88;
        local_168 = local_178;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  (in_stack_ffffffffffffe188,
                   (double)CONCAT17(in_stack_ffffffffffffe187,
                                    CONCAT16(in_stack_ffffffffffffe186,
                                             CONCAT15(in_stack_ffffffffffffe185,
                                                      in_stack_ffffffffffffe180))));
      }
    }
    local_2b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
    local_2b8 = local_13c8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    local_2c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
    local_2c8 = &local_1448;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    in_stack_ffffffffffffe0f8 =
         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_ffffffffffffe070,
                      CONCAT13(in_stack_ffffffffffffe06f,
                               CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffe070,
                 CONCAT13(in_stack_ffffffffffffe06f,
                          CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
    in_stack_ffffffffffffe104 =
         boost::multiprecision::operator>
                   ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)CONCAT17(in_stack_ffffffffffffe06f,
                                CONCAT16(in_stack_ffffffffffffe06e,
                                         CONCAT24(in_stack_ffffffffffffe06c,
                                                  in_stack_ffffffffffffe068))),
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)0x717d1c);
    if ((bool)in_stack_ffffffffffffe104) {
      local_2d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe070,
                               CONCAT13(in_stack_ffffffffffffe06f,
                                        CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c
                                                )));
      local_2d8 = &local_1448;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe06f,
                          CONCAT16(in_stack_ffffffffffffe06e,
                                   CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
    }
    else {
      in_stack_ffffffffffffe0e8 =
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffe070,
                        CONCAT13(in_stack_ffffffffffffe06f,
                                 CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe070,
                   CONCAT13(in_stack_ffffffffffffe06f,
                            CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
      in_stack_ffffffffffffe0f7 =
           boost::multiprecision::operator<
                     ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT17(in_stack_ffffffffffffe06f,
                                  CONCAT16(in_stack_ffffffffffffe06e,
                                           CONCAT24(in_stack_ffffffffffffe06c,
                                                    in_stack_ffffffffffffe068))),
                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)0x717db8);
      if ((bool)in_stack_ffffffffffffe0f7) {
        local_2e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe070,
                                 CONCAT13(in_stack_ffffffffffffe06f,
                                          CONCAT12(in_stack_ffffffffffffe06e,
                                                   in_stack_ffffffffffffe06c)));
        local_2e8 = local_13c8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                  );
      }
      else {
        in_stack_ffffffffffffe0e0 = local_1b88;
        local_150 = local_13c8;
        local_158 = &local_1448;
        local_148 = in_stack_ffffffffffffe0e0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_159,local_150,local_158);
        local_140 = in_stack_ffffffffffffe0e0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
        local_130 = local_150;
        local_138 = local_158;
        local_128 = in_stack_ffffffffffffe0e0;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                   ,(cpp_dec_float<200U,_int,_void> *)0x717eca);
        local_1b90 = 0x4000000000000000;
        local_b0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_1b88;
        local_b8 = &local_1b90;
        local_a8 = local_1b08;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,local_b0);
        local_a0 = local_1b08;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
        local_98 = local_b0;
        local_88 = local_b8;
        local_90 = local_1b08;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                   ,(double *)0x717f8e);
        local_350 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe070,
                                 CONCAT13(in_stack_ffffffffffffe06f,
                                          CONCAT12(in_stack_ffffffffffffe06e,
                                                   in_stack_ffffffffffffe06c)));
        local_358 = local_1b08;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe06f,
                            CONCAT16(in_stack_ffffffffffffe06e,
                                     CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068)))
                  );
      }
    }
    pnVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::maxObj(in_stack_ffffffffffffe070,
                      CONCAT13(in_stack_ffffffffffffe06f,
                               CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
    local_1b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
    local_1a8 = pnVar9;
    local_1a0 = local_1c10;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_1b1,pnVar9,local_1b0);
    local_198 = local_1c10;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
    local_188 = local_1a8;
    local_190 = local_1b0;
    local_180 = local_1c10;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))),
               (cpp_dec_float<200U,_int,_void> *)0x7180ad);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffe090,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffe08f,
                          CONCAT16(in_stack_ffffffffffffe08e,
                                   CONCAT15(in_stack_ffffffffffffe08d,in_stack_ffffffffffffe088))));
    pnVar9 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::maxObj(in_stack_ffffffffffffe070,
                      CONCAT13(in_stack_ffffffffffffe06f,
                               CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
    local_1f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
    local_1e8 = pnVar9;
    local_1e0 = local_1c90;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_1f1,pnVar9,local_1f0);
    local_1d8 = local_1c90;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
    local_1c8 = local_1e8;
    local_1d0 = local_1f0;
    local_1c0 = local_1c90;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))),
               (cpp_dec_float<200U,_int,_void> *)0x7181a0);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffe090,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffe08f,
                          CONCAT16(in_stack_ffffffffffffe08e,
                                   CONCAT15(in_stack_ffffffffffffe08d,in_stack_ffffffffffffe088))));
    in_stack_ffffffffffffe0a8 =
         (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::maxObj(in_stack_ffffffffffffe070,
                     CONCAT13(in_stack_ffffffffffffe06f,
                              CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c)));
    local_230 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe070,
                             CONCAT13(in_stack_ffffffffffffe06f,
                                      CONCAT12(in_stack_ffffffffffffe06e,in_stack_ffffffffffffe06c))
                            );
    local_228 = in_stack_ffffffffffffe0a8;
    local_220 = local_1d10;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_231,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_ffffffffffffe0a8,local_230);
    local_218 = local_1d10;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070);
    local_208 = local_228;
    local_210 = local_230;
    local_200 = local_1d10;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))),
               (cpp_dec_float<200U,_int,_void> *)0x718293);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffe090,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffe08f,
                          CONCAT16(in_stack_ffffffffffffe08e,
                                   CONCAT15(in_stack_ffffffffffffe08d,in_stack_ffffffffffffe088))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe070,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffe06f,
                           CONCAT16(in_stack_ffffffffffffe06e,
                                    CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))))
  ;
  bVar2 = checkSolution(in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,
                        in_stack_ffffffffffffe4a8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x718317);
  if ((bVar2) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe06f,
                                     CONCAT16(in_stack_ffffffffffffe06e,
                                              CONCAT24(in_stack_ffffffffffffe06c,
                                                       in_stack_ffffffffffffe068))),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x718340), tVar3)) {
    local_2f0 = in_RDI + 0x2b8;
    local_2f8 = local_718;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe070,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffe06f,
                           CONCAT16(in_stack_ffffffffffffe06e,
                                    CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))))
  ;
  bVar4 = checkSolution(in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,
                        in_stack_ffffffffffffe4a8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x718406);
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe06f,
                                     CONCAT16(in_stack_ffffffffffffe06e,
                                              CONCAT24(in_stack_ffffffffffffe06c,
                                                       in_stack_ffffffffffffe068))),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x71842f), tVar3)) {
    local_300 = in_RDI + 0x2b8;
    local_308 = local_798;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
  }
  bVar4 = 0;
  if ((local_819 & 1) != 0) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffe070,
                 (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffe06f,
                             CONCAT16(in_stack_ffffffffffffe06e,
                                      CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))
                            ));
    bVar4 = checkSolution(in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,
                          in_stack_ffffffffffffe4a8);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x718535);
  }
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe06f,
                                     CONCAT16(in_stack_ffffffffffffe06e,
                                              CONCAT24(in_stack_ffffffffffffe06c,
                                                       in_stack_ffffffffffffe068))),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x71855e), tVar3)) {
    local_310 = in_RDI + 0x2b8;
    local_318 = local_698;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe070,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe06f,
                        CONCAT16(in_stack_ffffffffffffe06e,
                                 CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_578,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffe06f,
                           CONCAT16(in_stack_ffffffffffffe06e,
                                    CONCAT24(in_stack_ffffffffffffe06c,in_stack_ffffffffffffe068))))
  ;
  bVar4 = checkSolution(in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0,
                        in_stack_ffffffffffffe4a8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x718630);
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffe06e,
                                                    CONCAT24(in_stack_ffffffffffffe06c,
                                                             in_stack_ffffffffffffe068))),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x718659), tVar3)) {
    local_320 = in_RDI + 0x2b8;
    local_328 = local_818;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (local_578,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT17(bVar4,CONCAT16(tVar3,CONCAT24(in_stack_ffffffffffffe06c,
                                                      in_stack_ffffffffffffe068))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x7186d8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x7186e5);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x7186f2);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x7186ff);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x71870c);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x718719);
  return;
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}